

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getBinaryExpression(TokenKind kind)

{
  TokenKind kind_local;
  SyntaxKind local_4;
  
  switch(kind) {
  case Slash:
    local_4 = DivideExpression;
    break;
  case Star:
    local_4 = MultiplyExpression;
    break;
  case DoubleStar:
    local_4 = PowerExpression;
    break;
  default:
    local_4 = Unknown;
    break;
  case Plus:
    local_4 = AddExpression;
    break;
  case Minus:
    local_4 = SubtractExpression;
    break;
  case MinusArrow:
    local_4 = LogicalImplicationExpression;
    break;
  case TildeXor:
    local_4 = BinaryXnorExpression;
    break;
  case Xor:
    local_4 = BinaryXorExpression;
    break;
  case XorTilde:
    local_4 = BinaryXnorExpression;
    break;
  case Equals:
    local_4 = AssignmentExpression;
    break;
  case DoubleEquals:
    local_4 = EqualityExpression;
    break;
  case DoubleEqualsQuestion:
    local_4 = WildcardEqualityExpression;
    break;
  case TripleEquals:
    local_4 = CaseEqualityExpression;
    break;
  case PlusEqual:
    local_4 = AddAssignmentExpression;
    break;
  case MinusEqual:
    local_4 = SubtractAssignmentExpression;
    break;
  case SlashEqual:
    local_4 = DivideAssignmentExpression;
    break;
  case StarEqual:
    local_4 = MultiplyAssignmentExpression;
    break;
  case AndEqual:
    local_4 = AndAssignmentExpression;
    break;
  case OrEqual:
    local_4 = OrAssignmentExpression;
    break;
  case PercentEqual:
    local_4 = ModAssignmentExpression;
    break;
  case XorEqual:
    local_4 = XorAssignmentExpression;
    break;
  case LeftShiftEqual:
    local_4 = LogicalLeftShiftAssignmentExpression;
    break;
  case TripleLeftShiftEqual:
    local_4 = ArithmeticLeftShiftAssignmentExpression;
    break;
  case RightShiftEqual:
    local_4 = LogicalRightShiftAssignmentExpression;
    break;
  case TripleRightShiftEqual:
    local_4 = ArithmeticRightShiftAssignmentExpression;
    break;
  case LeftShift:
    local_4 = LogicalShiftLeftExpression;
    break;
  case RightShift:
    local_4 = LogicalShiftRightExpression;
    break;
  case TripleLeftShift:
    local_4 = ArithmeticShiftLeftExpression;
    break;
  case TripleRightShift:
    local_4 = ArithmeticShiftRightExpression;
    break;
  case ExclamationEquals:
    local_4 = InequalityExpression;
    break;
  case ExclamationEqualsQuestion:
    local_4 = WildcardInequalityExpression;
    break;
  case ExclamationDoubleEquals:
    local_4 = CaseInequalityExpression;
    break;
  case Percent:
    local_4 = ModExpression;
    break;
  case LessThan:
    local_4 = LessThanExpression;
    break;
  case LessThanEquals:
    local_4 = LessThanEqualExpression;
    break;
  case LessThanMinusArrow:
    local_4 = LogicalEquivalenceExpression;
    break;
  case GreaterThan:
    local_4 = GreaterThanExpression;
    break;
  case GreaterThanEquals:
    local_4 = GreaterThanEqualExpression;
    break;
  case Or:
    local_4 = BinaryOrExpression;
    break;
  case DoubleOr:
    local_4 = LogicalOrExpression;
    break;
  case And:
    local_4 = BinaryAndExpression;
    break;
  case DoubleAnd:
    local_4 = LogicalAndExpression;
    break;
  case DistKeyword:
    local_4 = ExpressionOrDist;
    break;
  case InsideKeyword:
    local_4 = InsideExpression;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getBinaryExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::Plus: return SyntaxKind::AddExpression;
        case TokenKind::Minus: return SyntaxKind::SubtractExpression;
        case TokenKind::Star: return SyntaxKind::MultiplyExpression;
        case TokenKind::Slash: return SyntaxKind::DivideExpression;
        case TokenKind::Percent: return SyntaxKind::ModExpression;
        case TokenKind::DoubleStar: return SyntaxKind::PowerExpression;
        case TokenKind::DoubleEquals: return SyntaxKind::EqualityExpression;
        case TokenKind::ExclamationEquals: return SyntaxKind::InequalityExpression;
        case TokenKind::TripleEquals: return SyntaxKind::CaseEqualityExpression;
        case TokenKind::ExclamationDoubleEquals: return SyntaxKind::CaseInequalityExpression;
        case TokenKind::DoubleEqualsQuestion: return SyntaxKind::WildcardEqualityExpression;
        case TokenKind::ExclamationEqualsQuestion: return SyntaxKind::WildcardInequalityExpression;
        case TokenKind::DoubleAnd: return SyntaxKind::LogicalAndExpression;
        case TokenKind::DoubleOr: return SyntaxKind::LogicalOrExpression;
        case TokenKind::MinusArrow: return SyntaxKind::LogicalImplicationExpression;
        case TokenKind::LessThanMinusArrow: return SyntaxKind::LogicalEquivalenceExpression;
        case TokenKind::LessThan: return SyntaxKind::LessThanExpression;
        case TokenKind::LessThanEquals: return SyntaxKind::LessThanEqualExpression;
        case TokenKind::GreaterThan: return SyntaxKind::GreaterThanExpression;
        case TokenKind::GreaterThanEquals: return SyntaxKind::GreaterThanEqualExpression;
        case TokenKind::And: return SyntaxKind::BinaryAndExpression;
        case TokenKind::Or: return SyntaxKind::BinaryOrExpression;
        case TokenKind::Xor: return SyntaxKind::BinaryXorExpression;
        case TokenKind::XorTilde: return SyntaxKind::BinaryXnorExpression;
        case TokenKind::TildeXor: return SyntaxKind::BinaryXnorExpression;
        case TokenKind::RightShift: return SyntaxKind::LogicalShiftRightExpression;
        case TokenKind::TripleRightShift: return SyntaxKind::ArithmeticShiftRightExpression;
        case TokenKind::LeftShift: return SyntaxKind::LogicalShiftLeftExpression;
        case TokenKind::TripleLeftShift: return SyntaxKind::ArithmeticShiftLeftExpression;
        case TokenKind::InsideKeyword: return SyntaxKind::InsideExpression;
        case TokenKind::Equals: return SyntaxKind::AssignmentExpression;
        case TokenKind::PlusEqual: return SyntaxKind::AddAssignmentExpression;
        case TokenKind::MinusEqual: return SyntaxKind::SubtractAssignmentExpression;
        case TokenKind::StarEqual: return SyntaxKind::MultiplyAssignmentExpression;
        case TokenKind::SlashEqual: return SyntaxKind::DivideAssignmentExpression;
        case TokenKind::PercentEqual: return SyntaxKind::ModAssignmentExpression;
        case TokenKind::AndEqual: return SyntaxKind::AndAssignmentExpression;
        case TokenKind::OrEqual: return SyntaxKind::OrAssignmentExpression;
        case TokenKind::XorEqual: return SyntaxKind::XorAssignmentExpression;
        case TokenKind::LeftShiftEqual: return SyntaxKind::LogicalLeftShiftAssignmentExpression;
        case TokenKind::TripleLeftShiftEqual: return SyntaxKind::ArithmeticLeftShiftAssignmentExpression;
        case TokenKind::RightShiftEqual: return SyntaxKind::LogicalRightShiftAssignmentExpression;
        case TokenKind::TripleRightShiftEqual: return SyntaxKind::ArithmeticRightShiftAssignmentExpression;
        case TokenKind::DistKeyword: return SyntaxKind::ExpressionOrDist;
        default: return SyntaxKind::Unknown;
    }
}